

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorBase<slang::ast::HierarchicalReference::Element> * __thiscall
slang::SmallVectorBase<slang::ast::HierarchicalReference::Element>::operator=
          (SmallVectorBase<slang::ast::HierarchicalReference::Element> *this,
          SmallVectorBase<slang::ast::HierarchicalReference::Element> *rhs)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  pointer pEVar6;
  pointer pEVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  size_type sVar12;
  bool bVar13;
  
  if (this == rhs) {
    return this;
  }
  uVar3 = this->len;
  uVar4 = rhs->len;
  if (uVar3 < uVar4) {
    if (this->cap < uVar4) {
      this->len = 0;
      reserve(this,rhs->len);
    }
    else if (uVar3 != 0) {
      std::ranges::
      __copy_or_move<false,_const_slang::ast::HierarchicalReference::Element_*,_const_slang::ast::HierarchicalReference::Element_*,_slang::ast::HierarchicalReference::Element_*>
                (rhs->data_,rhs->data_ + uVar3,this->data_);
    }
    sVar5 = rhs->len;
    sVar12 = this->len;
    if (sVar12 == sVar5) goto LAB_002cfff4;
    pEVar6 = rhs->data_;
    pEVar7 = this->data_;
    lVar11 = sVar12 << 5;
    do {
      puVar1 = (undefined8 *)((long)&(pEVar6->symbol).ptr + lVar11);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)&(pEVar6->selector).
                       super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
               + lVar11 + 8);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)&(pEVar7->selector).
                       super__Variant_base<int,_std::pair<int,_int>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       .
                       super__Move_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_assign_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Move_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
                       .
                       super__Copy_ctor_alias<int,_std::pair<int,_int>,_std::basic_string_view<char>_>
               + lVar11 + 8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar1 = (undefined8 *)((long)&(pEVar7->symbol).ptr + lVar11);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      bVar13 = sVar5 * 0x20 + -0x20 == lVar11;
      if (bVar13) break;
      lVar11 = lVar11 + 0x20;
    } while (!bVar13);
  }
  else {
    if (uVar4 == 0) {
      sVar12 = 0;
      goto LAB_002cfff4;
    }
    std::ranges::
    __copy_or_move<false,_const_slang::ast::HierarchicalReference::Element_*,_const_slang::ast::HierarchicalReference::Element_*,_slang::ast::HierarchicalReference::Element_*>
              (rhs->data_,rhs->data_ + uVar4,this->data_);
  }
  sVar12 = rhs->len;
LAB_002cfff4:
  this->len = sVar12;
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(const SmallVectorBase<T>& rhs) {
    if (this == &rhs)
        return *this;

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::copy(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::copy(rhs.begin(), rhs.begin() + len, begin());
    }

    // Copy construct the new elements in place.
    std::ranges::uninitialized_copy(rhs.begin() + len, rhs.end(), begin() + len,
                                    begin() + rhs.size());
    len = rhs.size();
    return *this;
}